

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall
QLCDNumberPrivate::drawDigit
          (QLCDNumberPrivate *this,QPoint *pos,QPainter *p,int segLen,char newCh,char oldCh)

{
  char *pcVar1;
  char in_R8B;
  char in_R9B;
  long in_FS_OFFSET;
  char leaveAlone;
  char draw;
  char erase;
  int j;
  int i;
  char *segs;
  int nUpdates;
  int nErases;
  char updates [18] [2];
  undefined1 in_stack_0000050b;
  int in_stack_0000050c;
  QPainter *in_stack_00000510;
  char in_stack_0000051f;
  QPoint *in_stack_00000520;
  QLCDNumberPrivate *in_stack_00000528;
  int local_70;
  int local_6c;
  int local_60;
  int local_5c;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x24);
  pcVar1 = getSegments(in_R9B);
  for (local_5c = 0; pcVar1[local_5c] != 'c'; local_5c = local_5c + 1) {
    local_38[(long)local_5c * 2] = '\0';
    local_38[(long)local_5c * 2 + 1] = pcVar1[local_5c];
  }
  local_60 = local_5c;
  pcVar1 = getSegments(in_R8B);
  local_6c = 0;
  do {
    if (pcVar1[local_6c] == 'c') {
      for (local_6c = 0; local_6c < local_60; local_6c = local_6c + 1) {
        if (local_38[(long)local_6c * 2] == '\x01') {
          drawSegment(in_stack_00000528,in_stack_00000520,in_stack_0000051f,in_stack_00000510,
                      in_stack_0000050c,(bool)in_stack_0000050b);
        }
        if (local_38[(long)local_6c * 2] == '\0') {
          drawSegment(in_stack_00000528,in_stack_00000520,in_stack_0000051f,in_stack_00000510,
                      in_stack_0000050c,(bool)in_stack_0000050b);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    for (local_70 = 0; local_70 < local_5c; local_70 = local_70 + 1) {
      if (pcVar1[local_6c] == local_38[(long)local_70 * 2 + 1]) {
        local_38[(long)local_70 * 2] = '\x02';
        break;
      }
    }
    if (local_70 == local_5c) {
      local_38[(long)local_60 * 2] = '\x01';
      local_38[(long)local_60 * 2 + 1] = pcVar1[local_6c];
      local_60 = local_60 + 1;
    }
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

void QLCDNumberPrivate::drawDigit(const QPoint &pos, QPainter &p, int segLen,
                                  char newCh, char oldCh)
{
// Draws and/or erases segments to change display of a single digit
// from oldCh to newCh

    char updates[18][2];        // can hold 2 times number of segments, only
                                // first 9 used if segment table is correct
    int  nErases;
    int  nUpdates;
    const char *segs;
    int  i,j;

    const char erase      = 0;
    const char draw       = 1;
    const char leaveAlone = 2;

    segs = getSegments(oldCh);
    for (nErases=0; segs[nErases] != 99; nErases++) {
        updates[nErases][0] = erase;            // get segments to erase to
        updates[nErases][1] = segs[nErases];    // remove old char
    }
    nUpdates = nErases;
    segs = getSegments(newCh);
    for(i = 0 ; segs[i] != 99 ; i++) {
        for (j=0;  j<nErases; j++)
            if (segs[i] == updates[j][1]) {   // same segment ?
                updates[j][0] = leaveAlone;     // yes, already on screen
                break;
            }
        if (j == nErases) {                   // if not already on screen
            updates[nUpdates][0] = draw;
            updates[nUpdates][1] = segs[i];
            nUpdates++;
        }
    }
    for (i=0; i<nUpdates; i++) {
        if (updates[i][0] == draw)
            drawSegment(pos, updates[i][1], p, segLen);
        if (updates[i][0] == erase)
            drawSegment(pos, updates[i][1], p, segLen, true);
    }
}